

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int vorbis_decode_initial
              (vorb *f,int *p_left_start,int *p_left_end,int *p_right_start,int *p_right_end,
              int *mode)

{
  int iVar1;
  uint32 uVar2;
  Mode *pMVar3;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  vorb *in_RDI;
  int *in_R8;
  uint32 *in_R9;
  int window_center;
  int next;
  int prev;
  int n;
  int i;
  Mode *m;
  vorb *in_stack_ffffffffffffff98;
  vorb *in_stack_ffffffffffffffa0;
  vorb *pvVar4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint32 local_50;
  uint32 local_4c;
  int local_48;
  
  in_RDI->channel_buffer_end = 0;
  in_RDI->channel_buffer_start = 0;
  while( true ) {
    if (in_RDI->eof != 0) {
      return 0;
    }
    iVar1 = maybe_start_packet(in_stack_ffffffffffffff98);
    if (iVar1 == 0) {
      return 0;
    }
    uVar2 = get_bits((vorb *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    if (uVar2 == 0) break;
    if (in_RDI->push_mode != '\0') {
      iVar1 = error(in_RDI,VORBIS_bad_packet_type);
      return iVar1;
    }
    do {
      iVar1 = get8_packet(in_stack_ffffffffffffffa0);
    } while (iVar1 != -1);
  }
  pvVar4 = in_RDI;
  ilog(in_RDI->mode_count + -1);
  iVar1 = (int)((ulong)pvVar4 >> 0x20);
  uVar2 = get_bits((vorb *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),iVar1);
  if (uVar2 == 0xffffffff) {
    return 0;
  }
  if (in_RDI->mode_count <= (int)uVar2) {
    return 0;
  }
  *in_R9 = uVar2;
  pMVar3 = in_RDI->mode_config + (int)uVar2;
  if (pMVar3->blockflag == '\0') {
    local_50 = 0;
    local_4c = 0;
    local_48 = in_RDI->blocksize_0;
  }
  else {
    local_48 = in_RDI->blocksize_1;
    local_4c = get_bits((vorb *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),iVar1)
    ;
    local_50 = get_bits((vorb *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),iVar1)
    ;
  }
  if ((pMVar3->blockflag == '\0') || (local_4c != 0)) {
    *in_RSI = 0;
    *in_RDX = local_48 >> 1;
  }
  else {
    *in_RSI = local_48 - in_RDI->blocksize_0 >> 2;
    *in_RDX = local_48 + in_RDI->blocksize_0 >> 2;
  }
  if ((pMVar3->blockflag == '\0') || (local_50 != 0)) {
    *in_RCX = local_48 >> 1;
    *in_R8 = local_48;
  }
  else {
    *in_RCX = local_48 * 3 - in_RDI->blocksize_0 >> 2;
    *in_R8 = local_48 * 3 + in_RDI->blocksize_0 >> 2;
  }
  return 1;
}

Assistant:

static int vorbis_decode_initial(vorb *f, int *p_left_start, int *p_left_end, int *p_right_start, int *p_right_end, int *mode)
{
   Mode *m;
   int i, n, prev, next, window_center;
   f->channel_buffer_start = f->channel_buffer_end = 0;

  retry:
   if (f->eof) return FALSE;
   if (!maybe_start_packet(f))
      return FALSE;
   // check packet type
   if (get_bits(f,1) != 0) {
      if (IS_PUSH_MODE(f))
         return error(f,VORBIS_bad_packet_type);
      while (EOP != get8_packet(f));
      goto retry;
   }

   if (f->alloc.alloc_buffer)
      assert(f->alloc.alloc_buffer_length_in_bytes == f->temp_offset);

   i = get_bits(f, ilog(f->mode_count-1));
   if (i == EOP) return FALSE;
   if (i >= f->mode_count) return FALSE;
   *mode = i;
   m = f->mode_config + i;
   if (m->blockflag) {
      n = f->blocksize_1;
      prev = get_bits(f,1);
      next = get_bits(f,1);
   } else {
      prev = next = 0;
      n = f->blocksize_0;
   }

// WINDOWING

   window_center = n >> 1;
   if (m->blockflag && !prev) {
      *p_left_start = (n - f->blocksize_0) >> 2;
      *p_left_end   = (n + f->blocksize_0) >> 2;
   } else {
      *p_left_start = 0;
      *p_left_end   = window_center;
   }
   if (m->blockflag && !next) {
      *p_right_start = (n*3 - f->blocksize_0) >> 2;
      *p_right_end   = (n*3 + f->blocksize_0) >> 2;
   } else {
      *p_right_start = window_center;
      *p_right_end   = n;
   }

   return TRUE;
}